

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O1

void opengv::relative_pose::modules::fivept_kneip::sPolynomial35
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[5];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[6];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x65] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x47] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x48] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x89] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x8a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xcb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xcc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[299] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x16d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x150] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1af] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x191] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x192] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x233] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x215] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x216] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x299] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x29a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2f9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2db] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2dc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x33b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x37d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x35f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x360] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x3bf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3a1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3a2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x401] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3e3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3e4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x443] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x425] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x426] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x4c7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4a9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4aa] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x509] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4eb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4ec] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x54b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x52d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x52e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x58d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x56f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x570] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x5cf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5b1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5b2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x611] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5f3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5f4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x695] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x677] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x678] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x6d7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6b9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6ba] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x719] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6fb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6fc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x75b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x73d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x73e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x79d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x77f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x780] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x7df] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x7c1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x7c2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x8a5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x887] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x888] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x8e7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x8c9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x8ca] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa31] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa13] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa14] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa73] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa55] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa56] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xab5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa97] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa98] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xaf7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xad9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xada] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xb39] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb1b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb1c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xb7b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb5d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb5e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xbbd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb9f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xba0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xbff] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xbe1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xbe2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xc41] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc23] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc24] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xc83] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc65] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc66] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xcc5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xca7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xca8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xd07] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xce9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xcea] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xd49] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd2b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd2c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xd8b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd6d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd6e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xdcd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdaf] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdb0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe0f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdf1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdf2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe51] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe33] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe34] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe93] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe75] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe76] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xed5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xeb7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xeb8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xf17] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xef9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xefa] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xf59] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf3b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf3c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xf9b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf7d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf7e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xfdd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xfbf] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xfc0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x101f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1001] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1002] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x10a3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1085] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1086] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x10e5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10c7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10c8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1127] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1109] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x110a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1169] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x114b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x114c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x11ab] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x118d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x118e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x11ed] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x11cf] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x11d0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x122f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1211] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1212] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1271] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1253] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1254] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x12f5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x12d7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x12d8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1337] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1319] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x131a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x13bb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x139d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x139e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x13fd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x13df] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x13e0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x143f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1421] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1422] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1481] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1463] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1464] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x14c3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14a5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14a6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1505] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14e7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14e8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1547] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1529] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x152a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1589] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x156b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x156c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x15cb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15ad] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15ae] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x160d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15ef] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15f0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x164f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1631] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1632] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1691] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1673] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1674] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1715] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x16f7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x16f8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1799] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x177b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x177c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x17db] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x17bd] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x17be] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x185f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1841] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1842] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1925] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1907] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1908] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1967] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1949] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x194a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x19a9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x198b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x198c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x19eb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x19cd] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x19ce] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1a2d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a0f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a10] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1ab1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a93] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a94] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1af3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ad5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ad6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1b35] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b17] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b18] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1b77] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b59] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b5a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1bb9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b9b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b9c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1bfb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1bdd] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1bde] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c3d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c1f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c20] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c7f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c61] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c62] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1cc1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ca3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ca4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1d03] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ce5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ce6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1d45] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1d27] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1d28] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1dc9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1dab] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1dac] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e0b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ded] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1dee] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e8f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1e71] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1e72] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1ed1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1eb3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1eb4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f13] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ef5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ef6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f55] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f37] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f38] / dVar2;
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[5];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[6];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f97] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f79] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f7a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fd9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1fbb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1fbc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x205d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x203f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2040] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x209f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2081] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2082] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x20e1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x20c3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x20c4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2123] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2105] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2106] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2165] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2147] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2148] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x21a7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2189] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x218a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x226d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x224f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2250] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x22af] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2291] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2292] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2333] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2315] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2316] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2375] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2357] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2358] / dVar2;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial35( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(35,1) = (groebnerMatrix(5,1)/(groebnerMatrix(5,0))-groebnerMatrix(6,1)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,2) = (groebnerMatrix(5,2)/(groebnerMatrix(5,0))-groebnerMatrix(6,2)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,3) = (groebnerMatrix(5,3)/(groebnerMatrix(5,0))-groebnerMatrix(6,3)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,4) = (groebnerMatrix(5,4)/(groebnerMatrix(5,0))-groebnerMatrix(6,4)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,5) = (groebnerMatrix(5,5)/(groebnerMatrix(5,0))-groebnerMatrix(6,5)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,6) = (groebnerMatrix(5,6)/(groebnerMatrix(5,0))-groebnerMatrix(6,6)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,8) = (groebnerMatrix(5,8)/(groebnerMatrix(5,0))-groebnerMatrix(6,8)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,10) = (groebnerMatrix(5,10)/(groebnerMatrix(5,0))-groebnerMatrix(6,10)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,11) = (groebnerMatrix(5,11)/(groebnerMatrix(5,0))-groebnerMatrix(6,11)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,12) = (groebnerMatrix(5,12)/(groebnerMatrix(5,0))-groebnerMatrix(6,12)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,13) = (groebnerMatrix(5,13)/(groebnerMatrix(5,0))-groebnerMatrix(6,13)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,14) = (groebnerMatrix(5,14)/(groebnerMatrix(5,0))-groebnerMatrix(6,14)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,15) = (groebnerMatrix(5,15)/(groebnerMatrix(5,0))-groebnerMatrix(6,15)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,16) = (groebnerMatrix(5,16)/(groebnerMatrix(5,0))-groebnerMatrix(6,16)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,18) = (groebnerMatrix(5,18)/(groebnerMatrix(5,0))-groebnerMatrix(6,18)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,19) = (groebnerMatrix(5,19)/(groebnerMatrix(5,0))-groebnerMatrix(6,19)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,20) = (groebnerMatrix(5,20)/(groebnerMatrix(5,0))-groebnerMatrix(6,20)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,21) = (groebnerMatrix(5,21)/(groebnerMatrix(5,0))-groebnerMatrix(6,21)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,22) = (groebnerMatrix(5,22)/(groebnerMatrix(5,0))-groebnerMatrix(6,22)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,23) = (groebnerMatrix(5,23)/(groebnerMatrix(5,0))-groebnerMatrix(6,23)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,25) = (groebnerMatrix(5,25)/(groebnerMatrix(5,0))-groebnerMatrix(6,25)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,26) = (groebnerMatrix(5,26)/(groebnerMatrix(5,0))-groebnerMatrix(6,26)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,27) = (groebnerMatrix(5,27)/(groebnerMatrix(5,0))-groebnerMatrix(6,27)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,28) = (groebnerMatrix(5,28)/(groebnerMatrix(5,0))-groebnerMatrix(6,28)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,29) = (groebnerMatrix(5,29)/(groebnerMatrix(5,0))-groebnerMatrix(6,29)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,30) = (groebnerMatrix(5,30)/(groebnerMatrix(5,0))-groebnerMatrix(6,30)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,33) = (groebnerMatrix(5,33)/(groebnerMatrix(5,0))-groebnerMatrix(6,33)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,34) = (groebnerMatrix(5,34)/(groebnerMatrix(5,0))-groebnerMatrix(6,34)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,39) = (groebnerMatrix(5,39)/(groebnerMatrix(5,0))-groebnerMatrix(6,39)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,40) = (groebnerMatrix(5,40)/(groebnerMatrix(5,0))-groebnerMatrix(6,40)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,41) = (groebnerMatrix(5,41)/(groebnerMatrix(5,0))-groebnerMatrix(6,41)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,42) = (groebnerMatrix(5,42)/(groebnerMatrix(5,0))-groebnerMatrix(6,42)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,43) = (groebnerMatrix(5,43)/(groebnerMatrix(5,0))-groebnerMatrix(6,43)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,44) = (groebnerMatrix(5,44)/(groebnerMatrix(5,0))-groebnerMatrix(6,44)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,45) = (groebnerMatrix(5,45)/(groebnerMatrix(5,0))-groebnerMatrix(6,45)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,46) = (groebnerMatrix(5,46)/(groebnerMatrix(5,0))-groebnerMatrix(6,46)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,47) = (groebnerMatrix(5,47)/(groebnerMatrix(5,0))-groebnerMatrix(6,47)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,48) = (groebnerMatrix(5,48)/(groebnerMatrix(5,0))-groebnerMatrix(6,48)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,49) = (groebnerMatrix(5,49)/(groebnerMatrix(5,0))-groebnerMatrix(6,49)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,50) = (groebnerMatrix(5,50)/(groebnerMatrix(5,0))-groebnerMatrix(6,50)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,51) = (groebnerMatrix(5,51)/(groebnerMatrix(5,0))-groebnerMatrix(6,51)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,52) = (groebnerMatrix(5,52)/(groebnerMatrix(5,0))-groebnerMatrix(6,52)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,53) = (groebnerMatrix(5,53)/(groebnerMatrix(5,0))-groebnerMatrix(6,53)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,54) = (groebnerMatrix(5,54)/(groebnerMatrix(5,0))-groebnerMatrix(6,54)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,55) = (groebnerMatrix(5,55)/(groebnerMatrix(5,0))-groebnerMatrix(6,55)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,56) = (groebnerMatrix(5,56)/(groebnerMatrix(5,0))-groebnerMatrix(6,56)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,57) = (groebnerMatrix(5,57)/(groebnerMatrix(5,0))-groebnerMatrix(6,57)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,58) = (groebnerMatrix(5,58)/(groebnerMatrix(5,0))-groebnerMatrix(6,58)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,59) = (groebnerMatrix(5,59)/(groebnerMatrix(5,0))-groebnerMatrix(6,59)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,60) = (groebnerMatrix(5,60)/(groebnerMatrix(5,0))-groebnerMatrix(6,60)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,61) = (groebnerMatrix(5,61)/(groebnerMatrix(5,0))-groebnerMatrix(6,61)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,62) = (groebnerMatrix(5,62)/(groebnerMatrix(5,0))-groebnerMatrix(6,62)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,64) = (groebnerMatrix(5,64)/(groebnerMatrix(5,0))-groebnerMatrix(6,64)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,65) = (groebnerMatrix(5,65)/(groebnerMatrix(5,0))-groebnerMatrix(6,65)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,66) = (groebnerMatrix(5,66)/(groebnerMatrix(5,0))-groebnerMatrix(6,66)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,67) = (groebnerMatrix(5,67)/(groebnerMatrix(5,0))-groebnerMatrix(6,67)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,68) = (groebnerMatrix(5,68)/(groebnerMatrix(5,0))-groebnerMatrix(6,68)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,69) = (groebnerMatrix(5,69)/(groebnerMatrix(5,0))-groebnerMatrix(6,69)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,70) = (groebnerMatrix(5,70)/(groebnerMatrix(5,0))-groebnerMatrix(6,70)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,71) = (groebnerMatrix(5,71)/(groebnerMatrix(5,0))-groebnerMatrix(6,71)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,73) = (groebnerMatrix(5,73)/(groebnerMatrix(5,0))-groebnerMatrix(6,73)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,74) = (groebnerMatrix(5,74)/(groebnerMatrix(5,0))-groebnerMatrix(6,74)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,76) = (groebnerMatrix(5,76)/(groebnerMatrix(5,0))-groebnerMatrix(6,76)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,77) = (groebnerMatrix(5,77)/(groebnerMatrix(5,0))-groebnerMatrix(6,77)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,78) = (groebnerMatrix(5,78)/(groebnerMatrix(5,0))-groebnerMatrix(6,78)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,79) = (groebnerMatrix(5,79)/(groebnerMatrix(5,0))-groebnerMatrix(6,79)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,80) = (groebnerMatrix(5,80)/(groebnerMatrix(5,0))-groebnerMatrix(6,80)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,81) = (groebnerMatrix(5,81)/(groebnerMatrix(5,0))-groebnerMatrix(6,81)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,82) = (groebnerMatrix(5,82)/(groebnerMatrix(5,0))-groebnerMatrix(6,82)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,83) = (groebnerMatrix(5,83)/(groebnerMatrix(5,0))-groebnerMatrix(6,83)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,84) = (groebnerMatrix(5,84)/(groebnerMatrix(5,0))-groebnerMatrix(6,84)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,85) = (groebnerMatrix(5,85)/(groebnerMatrix(5,0))-groebnerMatrix(6,85)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,86) = (groebnerMatrix(5,86)/(groebnerMatrix(5,0))-groebnerMatrix(6,86)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,87) = (groebnerMatrix(5,87)/(groebnerMatrix(5,0))-groebnerMatrix(6,87)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,89) = (groebnerMatrix(5,89)/(groebnerMatrix(5,0))-groebnerMatrix(6,89)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,91) = (groebnerMatrix(5,91)/(groebnerMatrix(5,0))-groebnerMatrix(6,91)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,92) = (groebnerMatrix(5,92)/(groebnerMatrix(5,0))-groebnerMatrix(6,92)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,94) = (groebnerMatrix(5,94)/(groebnerMatrix(5,0))-groebnerMatrix(6,94)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,97) = (groebnerMatrix(5,97)/(groebnerMatrix(5,0))-groebnerMatrix(6,97)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,98) = (groebnerMatrix(5,98)/(groebnerMatrix(5,0))-groebnerMatrix(6,98)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,99) = (groebnerMatrix(5,99)/(groebnerMatrix(5,0))-groebnerMatrix(6,99)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,100) = (groebnerMatrix(5,100)/(groebnerMatrix(5,0))-groebnerMatrix(6,100)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,101) = (groebnerMatrix(5,101)/(groebnerMatrix(5,0))-groebnerMatrix(6,101)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,103) = (groebnerMatrix(5,103)/(groebnerMatrix(5,0))-groebnerMatrix(6,103)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,104) = (groebnerMatrix(5,104)/(groebnerMatrix(5,0))-groebnerMatrix(6,104)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,105) = (groebnerMatrix(5,105)/(groebnerMatrix(5,0))-groebnerMatrix(6,105)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,106) = (groebnerMatrix(5,106)/(groebnerMatrix(5,0))-groebnerMatrix(6,106)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,107) = (groebnerMatrix(5,107)/(groebnerMatrix(5,0))-groebnerMatrix(6,107)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,108) = (groebnerMatrix(5,108)/(groebnerMatrix(5,0))-groebnerMatrix(6,108)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,109) = (groebnerMatrix(5,109)/(groebnerMatrix(5,0))-groebnerMatrix(6,109)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,110) = (groebnerMatrix(5,110)/(groebnerMatrix(5,0))-groebnerMatrix(6,110)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,111) = (groebnerMatrix(5,111)/(groebnerMatrix(5,0))-groebnerMatrix(6,111)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,112) = (groebnerMatrix(5,112)/(groebnerMatrix(5,0))-groebnerMatrix(6,112)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,113) = (groebnerMatrix(5,113)/(groebnerMatrix(5,0))-groebnerMatrix(6,113)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,115) = (groebnerMatrix(5,115)/(groebnerMatrix(5,0))-groebnerMatrix(6,115)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,116) = (groebnerMatrix(5,116)/(groebnerMatrix(5,0))-groebnerMatrix(6,116)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,118) = (groebnerMatrix(5,118)/(groebnerMatrix(5,0))-groebnerMatrix(6,118)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,119) = (groebnerMatrix(5,119)/(groebnerMatrix(5,0))-groebnerMatrix(6,119)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,120) = (groebnerMatrix(5,120)/(groebnerMatrix(5,0))-groebnerMatrix(6,120)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,121) = (groebnerMatrix(5,121)/(groebnerMatrix(5,0))-groebnerMatrix(6,121)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,122) = (groebnerMatrix(5,122)/(groebnerMatrix(5,0))-groebnerMatrix(6,122)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,123) = (groebnerMatrix(5,123)/(groebnerMatrix(5,0))-groebnerMatrix(6,123)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,125) = (groebnerMatrix(5,125)/(groebnerMatrix(5,0))-groebnerMatrix(6,125)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,126) = (groebnerMatrix(5,126)/(groebnerMatrix(5,0))-groebnerMatrix(6,126)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,127) = (groebnerMatrix(5,127)/(groebnerMatrix(5,0))-groebnerMatrix(6,127)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,128) = (groebnerMatrix(5,128)/(groebnerMatrix(5,0))-groebnerMatrix(6,128)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,129) = (groebnerMatrix(5,129)/(groebnerMatrix(5,0))-groebnerMatrix(6,129)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,130) = (groebnerMatrix(5,130)/(groebnerMatrix(5,0))-groebnerMatrix(6,130)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,133) = (groebnerMatrix(5,133)/(groebnerMatrix(5,0))-groebnerMatrix(6,133)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,134) = (groebnerMatrix(5,134)/(groebnerMatrix(5,0))-groebnerMatrix(6,134)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,136) = (groebnerMatrix(5,136)/(groebnerMatrix(5,0))-groebnerMatrix(6,136)/(groebnerMatrix(6,0)));
  groebnerMatrix(35,137) = (groebnerMatrix(5,137)/(groebnerMatrix(5,0))-groebnerMatrix(6,137)/(groebnerMatrix(6,0)));
}